

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFArgParser.hh
# Opt level: O0

void __thiscall
QPDFArgParser::HelpTopic::HelpTopic(HelpTopic *this,string *short_text,string *long_text)

{
  string *long_text_local;
  string *short_text_local;
  HelpTopic *this_local;
  
  std::__cxx11::string::string((string *)this,(string *)short_text);
  std::__cxx11::string::string((string *)&this->long_text,(string *)long_text);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set(&this->options);
  return;
}

Assistant:

HelpTopic(std::string const& short_text, std::string const& long_text) :
            short_text(short_text),
            long_text(long_text)
        {
        }